

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslationalOrderParamZ.cpp
# Opt level: O0

void __thiscall
OpenMD::TranslationalOrderParamZ::collectHistogram
          (TranslationalOrderParamZ *this,StuntDouble *sd1,StuntDouble *sd2)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  reference pvVar5;
  double *pdVar6;
  reference pvVar7;
  reference pvVar8;
  int iVar9;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar10;
  double dVar11;
  int zBin2;
  int zBin1;
  int whichBin;
  RealType distance;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  RealType boxZ;
  bool usePeriodicBoundaryConditions_;
  Vector<double,_3U> *in_stack_ffffffffffffff38;
  double dVar12;
  Vector<double,_3U> *in_stack_ffffffffffffff40;
  StuntDouble *in_stack_ffffffffffffff48;
  double dVar13;
  Vector3d *in_stack_ffffffffffffffb8;
  Snapshot *in_stack_ffffffffffffffc0;
  
  if (in_RSI != in_RDX) {
    SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
    bVar4 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1e8fd9);
    pvVar5 = std::vector<double,_std::allocator<double>_>::back
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40);
    dVar1 = *pvVar5;
    StuntDouble::getPos(in_stack_ffffffffffffff48);
    StuntDouble::getPos(in_stack_ffffffffffffff48);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
    ;
    if (bVar4) {
      Snapshot::wrapVector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      Snapshot::wrapVector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      Snapshot::wrapVector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    dVar10 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1e90a6);
    if (dVar10 < *(double *)(in_RDI + 0xfb0)) {
      iVar9 = (int)(dVar10 / *(double *)(in_RDI + 0xfc8));
      dVar11 = (double)*(int *)(in_RDI + 0xfd0);
      dVar12 = dVar1;
      pdVar6 = Vector<double,_3U>::operator[]
                         ((Vector<double,_3U> *)&stack0xffffffffffffffc0,*(uint *)(in_RDI + 0x1048))
      ;
      dVar10 = *pdVar6;
      iVar3 = *(int *)(in_RDI + 0xfd0);
      dVar13 = dVar1;
      pdVar6 = Vector<double,_3U>::operator[]
                         ((Vector<double,_3U> *)&stack0xffffffffffffffa8,*(uint *)(in_RDI + 0x1048))
      ;
      dVar2 = *pdVar6;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0xfe8),(long)iVar9);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar7,(long)(int)((dVar11 * (dVar12 * 0.5 + dVar10)) / dVar1));
      *pvVar8 = *pvVar8 + 1;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0xfe8),(long)iVar9);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar7,(long)(int)(((double)iVar3 * (dVar13 * 0.5 + dVar2)) / dVar1));
      *pvVar8 = *pvVar8 + 1;
    }
  }
  return;
}

Assistant:

void TranslationalOrderParamZ::collectHistogram(StuntDouble* sd1,
                                                  StuntDouble* sd2) {
    if (sd1 == sd2) { return; }

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();
    RealType boxZ = zBox_.back();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) {
      currentSnapshot_->wrapVector(r12);
      currentSnapshot_->wrapVector(pos1);
      currentSnapshot_->wrapVector(pos2);
    }

    RealType distance = r12.length();

    if (distance < len_) {
      int whichBin = int(distance / deltaR_);
      int zBin1    = int(nZBins_ * (0.5 * boxZ + pos1[axis_]) / boxZ);
      int zBin2    = int(nZBins_ * (0.5 * boxZ + pos2[axis_]) / boxZ);

      histogram_[whichBin][zBin1] += 1;
      histogram_[whichBin][zBin2] += 1;
    }
  }